

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void so_5::disp::one_thread::impl::data_source_details::track_activity
               (mbox_t *mbox,
               common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
               *data)

{
  work_thread_activity_stats_t local_58;
  id local_28;
  suffix_t local_20;
  common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *local_18;
  common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *data_local;
  mbox_t *mbox_local;
  
  local_18 = data;
  data_local = (common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                *)mbox;
  local_20 = stats::suffixes::work_thread_activity();
  local_28._M_thread =
       (native_handle_type)
       reuse::work_thread::details::
       work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>::
       thread_id(local_18->m_work_thread);
  reuse::work_thread::details::activity_tracking_impl_t::take_activity_stats
            (&local_58,&local_18->m_work_thread->super_activity_tracking_impl_t);
  send<so_5::stats::messages::work_thread_activity,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&data->m_base_prefix,&local_20,&local_28,&local_58);
  return;
}

Assistant:

inline void
track_activity(
	const mbox_t & mbox,
	const common_data_t< work_thread::work_thread_with_activity_tracking_t > & data )
	{
		so_5::send< stats::messages::work_thread_activity >(
				mbox,
				data.m_base_prefix,
				stats::suffixes::work_thread_activity(),
				data.m_work_thread.thread_id(),
				data.m_work_thread.take_activity_stats() );
	}